

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::~SlicePlane(SlicePlane *this)

{
  SlicePlane **__src;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Engine *this_00;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  __dest;
  string local_38;
  
  this_00 = render::engine;
  pcVar1 = (this->postfix)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->postfix)._M_string_length);
  render::Engine::removeSlicePlane(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<polyscope::SlicePlane**,std::vector<polyscope::SlicePlane*,std::allocator<polyscope::SlicePlane*>>>,__gnu_cxx::__ops::_Iter_equals_val<polyscope::SlicePlane*const>>
                     (state::slicePlanes,DAT_004badf8);
  if (__dest._M_current != DAT_004badf8) {
    __src = __dest._M_current + 1;
    if (__src != DAT_004badf8) {
      memmove(__dest._M_current,__src,(long)DAT_004badf8 - (long)__src);
    }
    DAT_004badf8 = DAT_004badf8 + -1;
  }
  p_Var2 = (this->planeProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  (this->transformGizmo).super_Widget._vptr_Widget = (_func_int **)&PTR_draw_004b6b80;
  p_Var2 = (this->transformGizmo).sphereProgram.
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->transformGizmo).arrowProgram.
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->transformGizmo).ringProgram.
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  PersistentValue<bool>::~PersistentValue(&(this->transformGizmo).enabled);
  pcVar1 = (this->transformGizmo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->transformGizmo).name.field_2) {
    operator_delete(pcVar1);
  }
  Widget::~Widget(&(this->transformGizmo).super_Widget);
  PersistentValue<float>::~PersistentValue(&this->transparency);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue(&this->color);
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::~PersistentValue
            (&this->objectTransform);
  PersistentValue<bool>::~PersistentValue(&this->drawPlane);
  PersistentValue<bool>::~PersistentValue(&this->active);
  pcVar1 = (this->postfix)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->postfix).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

SlicePlane::~SlicePlane() {
  render::engine->removeSlicePlane(postfix);
  auto pos = std::find(state::slicePlanes.begin(), state::slicePlanes.end(), this);
  if (pos == state::slicePlanes.end()) return;
  state::slicePlanes.erase(pos);
}